

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::Mutex::TryRemove(Mutex *this,PerThreadSynch *s)

{
  ulong uVar1;
  bool bVar2;
  bool local_229;
  ulong local_e8;
  intptr_t nv;
  PerThreadSynch *w;
  PerThreadSynch *pw;
  PerThreadSynch *local_c0;
  PerThreadSynch *h;
  intptr_t v;
  PerThreadSynch *pPStack_a8;
  ScopedDisable disable_rescheduling;
  PerThreadSynch *s_local;
  Mutex *this_local;
  memory_order __b_1;
  memory_order __b;
  
  pPStack_a8 = s;
  base_internal::SchedulingGuard::ScopedDisable::ScopedDisable((ScopedDisable *)((long)&v + 7));
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  if ((uVar1 & 0x4d) == 4) {
    LOCK();
    bVar2 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar2) {
      (this->mu_).super___atomic_base<long>._M_i = uVar1 | 0x48;
    }
    UNLOCK();
    if (bVar2) {
      local_c0 = GetPerThreadSynch(uVar1);
      if (local_c0 != (PerThreadSynch *)0x0) {
        nv = (intptr_t)local_c0->next;
        w = local_c0;
        if ((PerThreadSynch *)nv != pPStack_a8) {
          do {
            bVar2 = MuEquivalentWaiter(pPStack_a8,(PerThreadSynch *)nv);
            if (bVar2) {
              FixSkip((PerThreadSynch *)nv,pPStack_a8);
              w = (PerThreadSynch *)nv;
            }
            else {
              w = Skip((PerThreadSynch *)nv);
            }
            nv = (intptr_t)w->next;
            local_229 = (PerThreadSynch *)nv != pPStack_a8 && w != local_c0;
          } while (local_229);
        }
        if ((PerThreadSynch *)nv == pPStack_a8) {
          local_c0 = Dequeue(local_c0,w);
          pPStack_a8->next = (PerThreadSynch *)0x0;
          std::atomic<absl::base_internal::PerThreadSynch::State>::store
                    (&pPStack_a8->state,kAvailable,memory_order_release);
        }
      }
      do {
        std::operator&(memory_order_relaxed,__memory_order_mask);
        uVar1 = (this->mu_).super___atomic_base<long>._M_i;
        local_e8 = uVar1 & 0x12;
        if (local_c0 != (PerThreadSynch *)0x0) {
          local_e8 = (ulong)local_c0 | 4 | local_e8;
          local_c0->readers = 0;
          local_c0->maybe_unlocking = false;
        }
        LOCK();
        bVar2 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
        if (bVar2) {
          (this->mu_).super___atomic_base<long>._M_i = local_e8;
        }
        UNLOCK();
      } while (!bVar2);
    }
  }
  base_internal::SchedulingGuard::ScopedDisable::~ScopedDisable((ScopedDisable *)((long)&v + 7));
  return;
}

Assistant:

void Mutex::TryRemove(PerThreadSynch *s) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  intptr_t v = mu_.load(std::memory_order_relaxed);
  // acquire spinlock & lock
  if ((v & (kMuWait | kMuSpin | kMuWriter | kMuReader)) == kMuWait &&
      mu_.compare_exchange_strong(v, v | kMuSpin | kMuWriter,
                                  std::memory_order_acquire,
                                  std::memory_order_relaxed)) {
    PerThreadSynch *h = GetPerThreadSynch(v);
    if (h != nullptr) {
      PerThreadSynch *pw = h;   // pw is w's predecessor
      PerThreadSynch *w;
      if ((w = pw->next) != s) {  // search for thread,
        do {                      // processing at least one element
          // If the current element isn't equivalent to the waiter to be
          // removed, we can skip the entire chain.
          if (!MuEquivalentWaiter(s, w)) {
            pw = Skip(w);                // so skip all that won't match
            // we don't have to worry about dangling skip fields
            // in the threads we skipped; none can point to s
            // because they are in a different equivalence class.
          } else {          // seeking same condition
            FixSkip(w, s);  // fix up any skip pointer from w to s
            pw = w;
          }
          // don't search further if we found the thread, or we're about to
          // process the first thread again.
        } while ((w = pw->next) != s && pw != h);
      }
      if (w == s) {                 // found thread; remove it
        // pw->skip may be non-zero here; the loop above ensured that
        // no ancestor of s can skip to s, so removal is safe anyway.
        h = Dequeue(h, pw);
        s->next = nullptr;
        s->state.store(PerThreadSynch::kAvailable, std::memory_order_release);
      }
    }
    intptr_t nv;
    do {                        // release spinlock and lock
      v = mu_.load(std::memory_order_relaxed);
      nv = v & (kMuDesig | kMuEvent);
      if (h != nullptr) {
        nv |= kMuWait | reinterpret_cast<intptr_t>(h);
        h->readers = 0;            // we hold writer lock
        h->maybe_unlocking = false;  // finished unlocking
      }
    } while (!mu_.compare_exchange_weak(v, nv,
                                        std::memory_order_release,
                                        std::memory_order_relaxed));
  }
}